

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::__insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (iterator __first,int *__last)

{
  int iVar1;
  value_type __val;
  iterator __last_00;
  
  if (__first.i != __last) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last; __last_00.i = __last_00.i + 1) {
      iVar1 = *__last_00.i;
      if (iVar1 < *__first.i) {
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<int>::iterator,QList<int>::iterator>
                  (__first,__last_00,(iterator)(__last_00.i + 1));
        *__first.i = iVar1;
      }
      else {
        __unguarded_linear_insert<QList<int>::iterator,__gnu_cxx::__ops::_Val_less_iter>
                  (__last_00.i);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }